

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arm.cpp
# Opt level: O0

void __thiscall CArmArchitecture::Pass2(CArmArchitecture *this)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ArmPool *pAVar4;
  ArmPool *local_40;
  CArmArchitecture *this_local;
  
  uVar1 = this->PoolCount;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1;
  uVar3 = SUB168(auVar2 * ZEXT816(0x810),0);
  if (SUB168(auVar2 * ZEXT816(0x810),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pAVar4 = (ArmPool *)operator_new__(uVar3);
  if (uVar1 != 0) {
    local_40 = pAVar4;
    do {
      ArmPool::ArmPool(local_40);
      local_40 = local_40 + 1;
    } while (local_40 != pAVar4 + uVar1);
  }
  this->Pools = pAVar4;
  this->CurrentPool = 0;
  return;
}

Assistant:

void CArmArchitecture::Pass2()
{
	Pools = new ArmPool[PoolCount];
	CurrentPool = 0;
}